

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

ParseResult *
tinyusdz::prim::anon_unknown_0::ParseShaderInputConnectionProperty
          (ParseResult *__return_storage_ptr__,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *table,string *prop_name,Property *prop,string *name,
          TypedConnection<tinyusdz::Token> *target)

{
  TypedConnection<tinyusdz::Token> *this;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *pv;
  Attribute *pAVar4;
  AttrMeta *pAVar5;
  AttrMeta *pAVar6;
  allocator local_a9;
  string local_a8 [32];
  fmt local_88 [48];
  Attribute *local_58;
  Attribute *attr;
  undefined1 local_39;
  TypedConnection<tinyusdz::Token> *local_38;
  TypedConnection<tinyusdz::Token> *target_local;
  string *name_local;
  Property *prop_local;
  string *prop_name_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *table_local;
  ParseResult *ret;
  
  local_39 = 0;
  local_38 = target;
  target_local = (TypedConnection<tinyusdz::Token> *)name;
  name_local = (string *)prop;
  prop_local = (Property *)prop_name;
  prop_name_local = (string *)table;
  table_local = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__return_storage_ptr__;
  ParseResult::ParseResult(__return_storage_ptr__);
  __return_storage_ptr__->code = InternalError;
  iVar2 = ::std::__cxx11::string::compare((string *)prop_name);
  if (iVar2 == 0) {
    sVar3 = ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)prop_name_local,(key_type *)target_local);
    if (sVar3 == 0) {
      bVar1 = Property::is_empty((Property *)name_local);
      if (bVar1) {
        TypedConnection<tinyusdz::Token>::set_empty(local_38);
        pAVar4 = Property::get_attribute((Property *)name_local);
        pAVar5 = Attribute::metas(pAVar4);
        pAVar6 = TypedConnection<tinyusdz::Token>::metas(local_38);
        AttrMetas::operator=(pAVar6,pAVar5);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)prop_name_local,(value_type *)prop_name);
        __return_storage_ptr__->code = Success;
      }
      else {
        bVar1 = Property::is_attribute_connection((Property *)name_local);
        if (bVar1) {
          local_58 = Property::get_attribute((Property *)name_local);
          bVar1 = Attribute::is_connection(local_58);
          this = local_38;
          if (bVar1) {
            pv = Attribute::connections(local_58);
            TypedConnection<tinyusdz::Token>::set(this,pv);
            pAVar4 = Property::get_attribute((Property *)name_local);
            pAVar5 = Attribute::metas(pAVar4);
            pAVar6 = TypedConnection<tinyusdz::Token>::metas(local_38);
            AttrMetas::operator=(pAVar6,pAVar5);
            ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)prop_name_local,(value_type *)prop_name);
            __return_storage_ptr__->code = Success;
          }
          else {
            __return_storage_ptr__->code = InternalError;
            ::std::__cxx11::string::operator=
                      ((string *)&__return_storage_ptr__->err,
                       "Property is invalid Attribute connection.");
          }
        }
        else {
          __return_storage_ptr__->code = InternalError;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_a8,"Property `{}` must be Attribute connection.",&local_a9);
          fmt::format<std::__cxx11::string>
                    (local_88,(string *)local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_name)
          ;
          ::std::__cxx11::string::operator=
                    ((string *)&__return_storage_ptr__->err,(string *)local_88);
          ::std::__cxx11::string::~string((string *)local_88);
          ::std::__cxx11::string::~string(local_a8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        }
      }
    }
    else {
      __return_storage_ptr__->code = AlreadyProcessed;
    }
  }
  else {
    __return_storage_ptr__->code = Unmatched;
  }
  return __return_storage_ptr__;
}

Assistant:

static ParseResult ParseShaderInputConnectionProperty(std::set<std::string> &table, /* inout */
  const std::string prop_name,
  const Property &prop,
  const std::string &name,
  TypedConnection<value::token> &target) /* out */
{
  ParseResult ret;
  ret.code = ParseResult::ResultCode::InternalError;

#if 0
  if (prop_name.compare(name + ".connect") == 0) {
    std::string propname = removeSuffix(name, ".connect");
    if (table.count(propname)) {
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }
    if (auto pv = prop.get_relationTarget()) {
      TypedConnection<value::token> conn;
      conn.set(pv.value());
      conn.metas() = prop.get_attribute().metas();
      target = conn;
      table.insert(propname);
      ret.code = ParseResult::ResultCode::Success;
      return ret;
    } else {
      ret.code = ParseResult::ResultCode::InternalError;
      ret.err = "Property does not contain connectionPath.";
      return ret;
    }
#endif
  if (prop_name.compare(name) == 0) {
    if (table.count(name)) {
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }

    DCOUT("is_attribute = " << prop.is_attribute());
    DCOUT("is_attribute_connection = " << prop.is_attribute_connection());

    // allow empty value
    if (prop.is_empty()) {
      target.set_empty();
      target.metas() = prop.get_attribute().metas();
      table.insert(prop_name);
      ret.code = ParseResult::ResultCode::Success;
      return ret;
    } else if (prop.is_attribute_connection()) {
      const Attribute &attr = prop.get_attribute();
      if (attr.is_connection()) {
        target.set(attr.connections());
        target.metas() = prop.get_attribute().metas();

        table.insert(prop_name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      } else {
        ret.code = ParseResult::ResultCode::InternalError;
        ret.err = "Property is invalid Attribute connection.";
        return ret;
      }
    } else {
      ret.code = ParseResult::ResultCode::InternalError;
      ret.err = fmt::format("Property `{}` must be Attribute connection.", prop_name);
      return ret;
    }
  }

  ret.code = ParseResult::ResultCode::Unmatched;
  return ret;
}

// Rel with single targetPath(or empty)
#define PARSE_SINGLE_TARGET_PATH_RELATION(__table, __prop, __propname, __target) \
  if (prop.first == __propname) { \
    if (__table.count(__propname)) { \
       continue; \
    } \
    if (!prop.second.is_relationship()) { \
      PUSH_ERROR_AND_RETURN(fmt::format("Property `{}` must be a Relationship.", __propname)); \
    } \
    const Relationship &rel = prop.second.get_relationship(); \
    if (rel.is_path()) { \
      __target = rel; \
      table.insert(prop.first); \
      DCOUT("Added rel " << __propname); \
      continue; \
    } else if (rel.is_pathvector()) { \
      if (rel.targetPathVector.size() == 1) { \
        __target = rel; \
        table.insert(prop.first); \
        DCOUT("Added rel " << __propname); \
        continue; \
      } \
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` target is empty or has mutiple Paths. Must be single Path.", __propname)); \
    } else if (!rel.has_value()) { \
      /* define-only. accept  */ \
      __target = rel; \
      table.insert(prop.first); \
      DCOUT("Added rel " << __propname); \
    }